

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.h
# Opt level: O2

void __thiscall btSoftBodyWorldInfo::btSoftBodyWorldInfo(btSoftBodyWorldInfo *this)

{
  this->air_density = 1.2;
  this->water_density = 0.0;
  this->water_offset = 0.0;
  this->m_maxDisplacement = 1000.0;
  (this->water_normal).m_floats[0] = 0.0;
  (this->water_normal).m_floats[1] = 0.0;
  (this->water_normal).m_floats[2] = 0.0;
  (this->water_normal).m_floats[3] = 0.0;
  this->m_broadphase = (btBroadphaseInterface *)0x0;
  this->m_dispatcher = (btDispatcher *)0x0;
  (this->m_gravity).m_floats[0] = 0.0;
  (this->m_gravity).m_floats[1] = -10.0;
  (this->m_gravity).m_floats[2] = 0.0;
  (this->m_gravity).m_floats[3] = 0.0;
  (this->m_sparsesdf).cells.m_ownsMemory = true;
  (this->m_sparsesdf).cells.m_data = (Cell **)0x0;
  (this->m_sparsesdf).cells.m_size = 0;
  (this->m_sparsesdf).cells.m_capacity = 0;
  return;
}

Assistant:

btSoftBodyWorldInfo()
		:air_density((btScalar)1.2),
		water_density(0),
		water_offset(0),
		m_maxDisplacement(1000.f),//avoid soft body from 'exploding' so use some upper threshold of maximum motion that a node can travel per frame
		water_normal(0,0,0),
		m_broadphase(0),
		m_dispatcher(0),
		m_gravity(0,-10,0)
	{
	}